

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluContextInfo.cpp
# Opt level: O3

bool __thiscall glu::ES2ContextInfo::isVertexUniformLoopSupported(ES2ContextInfo *this)

{
  byte bVar1;
  
  if ((this->m_vertexUniformLoopsSupported).m_isComputed == true) {
    bVar1 = (this->m_vertexUniformLoopsSupported).m_value;
  }
  else {
    bVar1 = TryCompileProgram::operator()
                      (&(this->m_vertexUniformLoopsSupported).m_compute,
                       (this->super_ContextInfo).m_context);
    (this->m_vertexUniformLoopsSupported).m_value = (bool)bVar1;
    (this->m_vertexUniformLoopsSupported).m_isComputed = true;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool								isVertexUniformLoopSupported		(void) const	{ return m_vertexUniformLoopsSupported.getValue(m_context);		}